

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_top_k.cpp
# Opt level: O1

void __thiscall
duckdb::InternalApproxTopKState::Initialize(InternalApproxTopKState *this,idx_t kval)

{
  _Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_> _Var1
  ;
  undefined1 auVar2 [16];
  _Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_> _Var3
  ;
  uint64_t __new_size;
  _Head_base<0UL,_duckdb::ApproxTopKValue_*,_false> _Var4;
  ulong uVar5;
  
  this->k = kval;
  this->capacity = kval * 3;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = kval * 3;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x38),8) == 0) {
    uVar5 = SUB168(auVar2 * ZEXT816(0x38),0);
  }
  _Var3.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>)operator_new__(uVar5);
  if (kval != 0) {
    _Var4._M_head_impl =
         (ApproxTopKValue *)
         _Var3.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl;
    do {
      (_Var4._M_head_impl)->count = 0;
      (_Var4._M_head_impl)->index = 0;
      *(undefined4 *)&((_Var4._M_head_impl)->str_val).str = 0;
      *(hash_t *)((long)&(_Var4._M_head_impl)->str_val + 0x10) = 0;
      (_Var4._M_head_impl)->dataptr = (char *)0x0;
      (_Var4._M_head_impl)->size = 0;
      (_Var4._M_head_impl)->capacity = 0;
      _Var4._M_head_impl = _Var4._M_head_impl + 1;
    } while (_Var4._M_head_impl !=
             (ApproxTopKValue *)
             ((long)_Var3.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl +
             kval * 0xa8));
  }
  _Var1.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl =
       (this->stored_values).
       super_unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue[]>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ApproxTopKValue,_std::default_delete<duckdb::ApproxTopKValue[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
       .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>;
  (this->stored_values).
  super_unique_ptr<duckdb::ApproxTopKValue[],_std::default_delete<duckdb::ApproxTopKValue[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::ApproxTopKValue,_std::default_delete<duckdb::ApproxTopKValue[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ApproxTopKValue_*,_std::default_delete<duckdb::ApproxTopKValue[]>_>
  .super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false> =
       _Var3.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl;
  if (_Var1.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>._M_head_impl !=
      (ApproxTopKValue *)0x0) {
    operator_delete__((void *)_Var1.super__Head_base<0UL,_duckdb::ApproxTopKValue_*,_false>.
                              _M_head_impl);
  }
  ::std::
  vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
  ::reserve(&(this->values).
             super_vector<std::reference_wrapper<duckdb::ApproxTopKValue>,_std::allocator<std::reference_wrapper<duckdb::ApproxTopKValue>_>_>
            ,this->capacity);
  __new_size = NextPowerOfTwo(this->capacity << 3);
  this->filter_mask = __new_size - 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->filter,__new_size);
  return;
}

Assistant:

void Initialize(idx_t kval) {
		static constexpr idx_t MONITORED_VALUES_RATIO = 3;
		static constexpr idx_t FILTER_RATIO = 8;

		D_ASSERT(values.empty());
		D_ASSERT(lookup_map.empty());
		k = kval;
		capacity = kval * MONITORED_VALUES_RATIO;
		stored_values = make_unsafe_uniq_array_uninitialized<ApproxTopKValue>(capacity);
		values.reserve(capacity);

		// we scale the filter based on the amount of values we are monitoring
		idx_t filter_size = NextPowerOfTwo(capacity * FILTER_RATIO);
		filter_mask = filter_size - 1;
		filter.resize(filter_size);
	}